

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O3

void struct_suite::run(void)

{
  test_person();
  fail_missing_begin();
  fail_missing_end();
  fail_missing_second();
  fail_missing_first();
  fail_invalid_second();
  fail_invalid_first();
  return;
}

Assistant:

void run()
{
    test_person();
    fail_missing_begin();
    fail_missing_end();
    fail_missing_second();
    fail_missing_first();
    fail_invalid_second();
    fail_invalid_first();
}